

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O2

WebSocketMsg __thiscall asl::WebSocket::receive(WebSocket *this)

{
  SmartObject_ *pSVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  unsigned_short uVar7;
  int iVar8;
  longlong lVar9;
  ulong uVar10;
  WebSocket *in_RSI;
  int in_R8D;
  uint uVar11;
  byte mlen;
  byte b0;
  WebSocketMsg msg;
  ByteArray buffer;
  uint mask;
  Array<unsigned_char> local_38;
  
  Array<unsigned_char>::Array(&msg._data);
  do {
    Array<unsigned_char>::Array(&buffer);
    bVar6 = closed(in_RSI);
    if (bVar6) {
      WebSocketMsg::fix(&msg);
LAB_0012cf6c:
      (this->_socket).super_SmartObject._p = (SmartObject_ *)msg._data._a;
      LOCK();
      *(int *)((long)msg._data._a + -8) = *(int *)((long)msg._data._a + -8) + 1;
      UNLOCK();
      bVar6 = false;
      bVar2 = false;
      goto LAB_0012d12c;
    }
    (*((in_RSI->_socket).super_SmartObject._p)->_vptr_SmartObject_[0xc])();
    pSVar1 = (in_RSI->_socket).super_SmartObject._p;
    (*pSVar1->_vptr_SmartObject_[0xd])(pSVar1,&b0,1);
    pSVar1 = (in_RSI->_socket).super_SmartObject._p;
    (*pSVar1->_vptr_SmartObject_[0xd])(pSVar1,&mlen,1);
    bVar6 = closed(in_RSI);
    bVar5 = b0;
    bVar4 = mlen;
    if (bVar6) {
      WebSocketMsg::fix(&msg);
      goto LAB_0012cf6c;
    }
    uVar11 = mlen & 0x7f;
    if (uVar11 == 0x7e) {
      uVar7 = Socket::read<unsigned_short>(&in_RSI->_socket);
      uVar11 = (uint)uVar7;
    }
    else if ((char)uVar11 == '\x7f') {
      lVar9 = Socket::read<long_long>(&in_RSI->_socket);
      uVar11 = (uint)lVar9;
    }
    mask = 0;
    if ((char)bVar4 < '\0') {
      Socket::operator>>(&in_RSI->_socket,&mask);
    }
    Array<unsigned_char>::resize(&buffer,*(int *)(buffer._a + -0x10) + uVar11);
    if (0 < (int)uVar11) {
      pSVar1 = (in_RSI->_socket).super_SmartObject._p;
      (*pSVar1->_vptr_SmartObject_[0xd])
                (pSVar1,buffer._a + ((long)*(int *)(buffer._a + -0x10) - (ulong)uVar11),
                 (ulong)uVar11);
    }
    if ((char)bVar4 < '\0') {
      swapBytes<unsigned_int>(&mask);
      Array<unsigned_char>::resize(&buffer,*(int *)(buffer._a + -0x10) + 4);
      Array<unsigned_char>::resize(&buffer,*(int *)(buffer._a + -0x10) + -4);
      iVar8 = *(int *)(buffer._a + -0x10) / 4;
      if (iVar8 < 0) {
        iVar8 = -1;
      }
      for (uVar10 = 0; iVar8 + 1 != uVar10; uVar10 = uVar10 + 1) {
        *(uint *)(buffer._a + uVar10 * 4) = *(uint *)(buffer._a + uVar10 * 4) ^ mask;
      }
    }
    bVar3 = 0;
    switch(bVar5 & 0xf) {
    case 0:
    case 1:
    case 2:
      Array<unsigned_char>::append(&msg._data,&buffer);
      break;
    default:
      goto switchD_0012d02c_caseD_3;
    case 8:
      if (1 < *(int *)(buffer._a + -0x10)) {
        in_RSI->_code = (uint)(ushort)(*(ushort *)buffer._a << 8 | *(ushort *)buffer._a >> 8);
        Array<unsigned_char>::remove(&buffer,(char *)0x0);
        local_38._a = buffer._a;
        LOCK();
        *(int *)(buffer._a + -8) = *(int *)(buffer._a + -8) + 1;
        UNLOCK();
        Array<unsigned_char>::operator=(&msg._data,&local_38);
        Array<unsigned_char>::~Array(&local_38);
      }
      in_RSI->_closed = true;
      bVar3 = 1;
      (*((in_RSI->_socket).super_SmartObject._p)->_vptr_SmartObject_[0xb])();
      goto switchD_0012d02c_caseD_3;
    case 9:
      send(in_RSI,(int)buffer._a,(void *)(ulong)*(uint *)(buffer._a + -0x10),10,in_R8D);
      break;
    case 10:
      Array<unsigned_char>::clear(&buffer);
    }
    bVar3 = 0;
switchD_0012d02c_caseD_3:
    bVar2 = (bool)((char)bVar5 < '\0' | bVar3);
    bVar6 = true;
LAB_0012d12c:
    Array<unsigned_char>::~Array(&buffer);
    if (!bVar6) goto LAB_0012d158;
  } while (!bVar2);
  WebSocketMsg::fix(&msg);
  (this->_socket).super_SmartObject._p = (SmartObject_ *)msg._data._a;
  LOCK();
  *(int *)((long)msg._data._a + -8) = *(int *)((long)msg._data._a + -8) + 1;
  UNLOCK();
LAB_0012d158:
  Array<unsigned_char>::~Array(&msg._data);
  return (WebSocketMsg)(ByteArray)this;
}

Assistant:

WebSocketMsg WebSocket::receive()
{
	WebSocketMsg msg;
	bool haveMsg = false;
	while (!haveMsg)
	{
		ByteArray buffer;
		byte b0, mlen;
		DEBUG_LOG("receive\n");
		if (closed()) {
			return msg.fix();
		}
		DEBUG_LOG("avail %i\n", _socket.available());
		_socket >> b0 >> mlen;
		DEBUG_LOG("%i %i\n", b0, mlen);
		if (closed()) {
			return msg.fix();
		}
		bool fin = !!(b0 & 0x80);
		int opcode = b0 & 0x0f;
		bool masked = !!(mlen & 0x80);
		int len = mlen & 0x7f;
		if (len == 126)
		{
			len = _socket.read<unsigned short>();
		}
		else if (len == 127)
			len = (int)_socket.read<Long>(); // what if length larger than int?

		unsigned mask = 0;
		if (masked)
			_socket >> mask;

		buffer.resize(buffer.length() + len);
		if (len > 0)
			_socket.read(buffer.data() + buffer.length() - len, len);

		DEBUG_LOG("frame: op %i fin %i len %i\n", opcode, fin ? 1 : 0, (int)len);

		if (masked)
		{
			swapBytes(mask);
			buffer.resize(buffer.length() + 4);
			buffer.resize(buffer.length() - 4);
			int n = buffer.length() / 4 + 1;
			for (int i = 0; i < n; i++)
			{
				((unsigned*)buffer.data())[i] ^= mask;
			}
		}

		switch (opcode)
		{
		case 0: // continuation
		case 1: // text
		case 2: // binary
			msg.append(buffer);
			break;
		case 8: // connection close
		{
			if (buffer.length() >= 2) {
				_code = (buffer[0] << 8) | buffer[1];
				buffer.remove(0, 2);
				msg = buffer;
			}
			haveMsg = true;
			_closed = true;
			_socket.close();
			break;
		}
		case 9: // ping
			send(buffer.data(), buffer.length(), FRAME_PONG);
			break;
		case 10: // pong
			buffer.clear();
			break;
		}

		if (fin)
			haveMsg = true;
	}

	return msg.fix();
}